

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  bool bVar21;
  bool bVar22;
  int iVar23;
  long lVar24;
  float fVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar76;
  float fVar77;
  undefined1 auVar75 [16];
  float fVar78;
  float fVar79;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [16];
  float fVar87;
  uint uVar88;
  float fVar89;
  uint uVar90;
  float fVar91;
  uint uVar92;
  float fVar93;
  uint uVar94;
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar36 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                               super_CurveGeometry.super_Geometry.field_0x58 +
                    i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar7 + sVar8 * uVar36);
  fVar85 = *pfVar1;
  fVar67 = pfVar1[1];
  fVar69 = pfVar1[2];
  pfVar2 = (float *)(pcVar7 + sVar8 * (uVar36 + 1));
  fVar77 = *pfVar2;
  fVar78 = pfVar2[1];
  fVar81 = pfVar2[2];
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  pfVar3 = (float *)(pcVar7 + uVar36 * sVar8);
  fVar83 = *pfVar3;
  fVar91 = pfVar3[1];
  fVar93 = pfVar3[2];
  pfVar4 = (float *)(pcVar7 + sVar8 * (uVar36 + 1));
  fVar96 = *pfVar4;
  fVar99 = pfVar4[1];
  fVar101 = pfVar4[2];
  fVar103 = (space->vx).field_0.m128[0];
  fVar9 = (space->vx).field_0.m128[1];
  fVar10 = (space->vx).field_0.m128[2];
  fVar11 = (space->vy).field_0.m128[0];
  fVar12 = (space->vy).field_0.m128[1];
  fVar13 = (space->vy).field_0.m128[2];
  fVar14 = (space->vz).field_0.m128[0];
  fVar15 = (space->vz).field_0.m128[1];
  fVar16 = (space->vz).field_0.m128[2];
  fVar70 = fVar85 * fVar103 + fVar67 * fVar11 + fVar69 * fVar14;
  fVar72 = fVar85 * fVar9 + fVar67 * fVar12 + fVar69 * fVar15;
  fVar73 = fVar85 * fVar10 + fVar67 * fVar13 + fVar69 * fVar16;
  fVar85 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  fVar67 = pfVar1[3] * fVar85;
  fVar74 = fVar77 * fVar103 + fVar78 * fVar11 + fVar81 * fVar14;
  fVar76 = fVar77 * fVar9 + fVar78 * fVar12 + fVar81 * fVar15;
  fVar77 = fVar77 * fVar10 + fVar78 * fVar13 + fVar81 * fVar16;
  fVar69 = pfVar2[3] * fVar85;
  fVar87 = (fVar83 * fVar103 + fVar91 * fVar11 + fVar93 * fVar14) * 0.33333334 + fVar70;
  fVar89 = (fVar83 * fVar9 + fVar91 * fVar12 + fVar93 * fVar15) * 0.33333334 + fVar72;
  fVar91 = (fVar83 * fVar10 + fVar91 * fVar13 + fVar93 * fVar16) * 0.33333334 + fVar73;
  fVar93 = pfVar3[3] * fVar85 * 0.33333334 + fVar67;
  fVar78 = fVar74 - (fVar96 * fVar103 + fVar99 * fVar11 + fVar101 * fVar14) * 0.33333334;
  fVar81 = fVar76 - (fVar96 * fVar9 + fVar99 * fVar12 + fVar101 * fVar15) * 0.33333334;
  fVar83 = fVar77 - (fVar96 * fVar10 + fVar99 * fVar13 + fVar101 * fVar16) * 0.33333334;
  fVar85 = fVar69 - pfVar4[3] * fVar85 * 0.33333334;
  lVar24 = 0;
  local_168 = _DAT_01f7a9f0;
  local_178 = _DAT_01f7a9f0;
  local_1a8 = _DAT_01f7a9f0;
  local_148 = _DAT_01f7aa00;
  local_158 = _DAT_01f7aa00;
  local_198 = _DAT_01f7aa00;
  auVar61 = _DAT_01f7aa00;
  auVar48 = _DAT_01f7a9f0;
  bVar21 = true;
  do {
    bVar22 = bVar21;
    iVar23 = (int)lVar24;
    lVar5 = lVar24 * 4;
    fVar96 = *(float *)(bezier_basis0 + lVar5 + 0x1dc);
    fVar99 = *(float *)(bezier_basis0 + lVar5 + 0x1e0);
    fVar101 = *(float *)(bezier_basis0 + lVar5 + 0x1e4);
    fVar103 = *(float *)(bezier_basis0 + lVar5 + 0x1e8);
    lVar5 = lVar24 * 4;
    fVar9 = *(float *)(bezier_basis0 + lVar5 + 0x660);
    fVar10 = *(float *)(bezier_basis0 + lVar5 + 0x664);
    fVar11 = *(float *)(bezier_basis0 + lVar5 + 0x668);
    fVar12 = *(float *)(bezier_basis0 + lVar5 + 0x66c);
    lVar5 = lVar24 * 4;
    fVar13 = *(float *)(bezier_basis0 + lVar5 + 0xae4);
    fVar14 = *(float *)(bezier_basis0 + lVar5 + 0xae8);
    fVar15 = *(float *)(bezier_basis0 + lVar5 + 0xaec);
    fVar16 = *(float *)(bezier_basis0 + lVar5 + 0xaf0);
    lVar5 = lVar24 * 4;
    fVar17 = *(float *)(bezier_basis0 + lVar5 + 0xf68);
    fVar18 = *(float *)(bezier_basis0 + lVar5 + 0xf6c);
    fVar19 = *(float *)(bezier_basis0 + lVar5 + 0xf70);
    fVar20 = *(float *)(bezier_basis0 + lVar5 + 0xf74);
    auVar57._0_4_ = fVar70 * fVar96 + fVar87 * fVar9 + fVar78 * fVar13 + fVar74 * fVar17;
    auVar57._4_4_ = fVar70 * fVar99 + fVar87 * fVar10 + fVar78 * fVar14 + fVar74 * fVar18;
    auVar57._8_4_ = fVar70 * fVar101 + fVar87 * fVar11 + fVar78 * fVar15 + fVar74 * fVar19;
    auVar57._12_4_ = fVar70 * fVar103 + fVar87 * fVar12 + fVar78 * fVar16 + fVar74 * fVar20;
    auVar26._0_4_ = fVar72 * fVar96 + fVar89 * fVar9 + fVar81 * fVar13 + fVar76 * fVar17;
    auVar26._4_4_ = fVar72 * fVar99 + fVar89 * fVar10 + fVar81 * fVar14 + fVar76 * fVar18;
    auVar26._8_4_ = fVar72 * fVar101 + fVar89 * fVar11 + fVar81 * fVar15 + fVar76 * fVar19;
    auVar26._12_4_ = fVar72 * fVar103 + fVar89 * fVar12 + fVar81 * fVar16 + fVar76 * fVar20;
    auVar75._0_4_ = fVar73 * fVar96 + fVar91 * fVar9 + fVar83 * fVar13 + fVar77 * fVar17;
    auVar75._4_4_ = fVar73 * fVar99 + fVar91 * fVar10 + fVar83 * fVar14 + fVar77 * fVar18;
    auVar75._8_4_ = fVar73 * fVar101 + fVar91 * fVar11 + fVar83 * fVar15 + fVar77 * fVar19;
    auVar75._12_4_ = fVar73 * fVar103 + fVar91 * fVar12 + fVar83 * fVar16 + fVar77 * fVar20;
    fVar95 = fVar96 * fVar67 + fVar9 * fVar93 + fVar13 * fVar85 + fVar17 * fVar69;
    fVar98 = fVar99 * fVar67 + fVar10 * fVar93 + fVar14 * fVar85 + fVar18 * fVar69;
    fVar100 = fVar101 * fVar67 + fVar11 * fVar93 + fVar15 * fVar85 + fVar19 * fVar69;
    fVar102 = fVar103 * fVar67 + fVar12 * fVar93 + fVar16 * fVar85 + fVar20 * fVar69;
    lVar5 = lVar24 * 4;
    fVar96 = *(float *)(bezier_basis0 + lVar5 + 0x13ec);
    fVar99 = *(float *)(bezier_basis0 + lVar5 + 0x13f0);
    fVar101 = *(float *)(bezier_basis0 + lVar5 + 0x13f4);
    fVar103 = *(float *)(bezier_basis0 + lVar5 + 0x13f8);
    lVar5 = lVar24 * 4;
    fVar9 = *(float *)(bezier_basis0 + lVar5 + 0x1cf4);
    fVar10 = *(float *)(bezier_basis0 + lVar5 + 0x1cf8);
    fVar11 = *(float *)(bezier_basis0 + lVar5 + 0x1cfc);
    fVar12 = *(float *)(bezier_basis0 + lVar5 + 0x1d00);
    lVar5 = lVar24 * 4;
    fVar13 = *(float *)(bezier_basis0 + lVar5 + 0x2178);
    fVar14 = *(float *)(bezier_basis0 + lVar5 + 0x217c);
    fVar15 = *(float *)(bezier_basis0 + lVar5 + 0x2180);
    fVar16 = *(float *)(bezier_basis0 + lVar5 + 0x2184);
    lVar24 = lVar24 * 4;
    fVar17 = *(float *)(bezier_basis0 + lVar24 + 0x1870);
    fVar18 = *(float *)(bezier_basis0 + lVar24 + 0x1874);
    fVar19 = *(float *)(bezier_basis0 + lVar24 + 0x1878);
    fVar20 = *(float *)(bezier_basis0 + lVar24 + 0x187c);
    fVar59 = fVar70 * fVar96 + fVar87 * fVar17 + fVar78 * fVar9 + fVar74 * fVar13;
    fVar62 = fVar70 * fVar99 + fVar87 * fVar18 + fVar78 * fVar10 + fVar74 * fVar14;
    fVar63 = fVar70 * fVar101 + fVar87 * fVar19 + fVar78 * fVar11 + fVar74 * fVar15;
    fVar64 = fVar70 * fVar103 + fVar87 * fVar20 + fVar78 * fVar12 + fVar74 * fVar16;
    fVar79 = fVar72 * fVar96 + fVar89 * fVar17 + fVar81 * fVar9 + fVar76 * fVar13;
    fVar82 = fVar72 * fVar99 + fVar89 * fVar18 + fVar81 * fVar10 + fVar76 * fVar14;
    fVar84 = fVar72 * fVar101 + fVar89 * fVar19 + fVar81 * fVar11 + fVar76 * fVar15;
    fVar86 = fVar72 * fVar103 + fVar89 * fVar20 + fVar81 * fVar12 + fVar76 * fVar16;
    fVar25 = fVar73 * fVar96 + fVar91 * fVar17 + fVar83 * fVar9 + fVar77 * fVar13;
    fVar27 = fVar73 * fVar99 + fVar91 * fVar18 + fVar83 * fVar10 + fVar77 * fVar14;
    fVar28 = fVar73 * fVar101 + fVar91 * fVar19 + fVar83 * fVar11 + fVar77 * fVar15;
    fVar29 = fVar73 * fVar103 + fVar91 * fVar20 + fVar83 * fVar12 + fVar77 * fVar16;
    fVar96 = fVar96 * fVar67 + fVar17 * fVar93 + fVar9 * fVar85 + fVar13 * fVar69;
    fVar99 = fVar99 * fVar67 + fVar18 * fVar93 + fVar10 * fVar85 + fVar14 * fVar69;
    fVar101 = fVar101 * fVar67 + fVar19 * fVar93 + fVar11 * fVar85 + fVar15 * fVar69;
    fVar103 = fVar103 * fVar67 + fVar20 * fVar93 + fVar12 * fVar85 + fVar16 * fVar69;
    uVar88 = -(uint)(iVar23 == 0);
    uVar90 = -(uint)(iVar23 == 1);
    uVar92 = -(uint)(iVar23 == 2);
    uVar94 = -(uint)(iVar23 == 3);
    uVar36 = -(uint)(iVar23 == 7);
    uVar43 = -(uint)(iVar23 == 6);
    uVar44 = -(uint)(iVar23 == 5);
    uVar45 = -(uint)(iVar23 == 4);
    auVar46 = minps(local_1a8,auVar57);
    auVar47 = maxps(local_198,auVar57);
    auVar60._0_8_ =
         CONCAT44(auVar57._4_4_ - (float)(~uVar90 & (uint)fVar62) * 0.055555556,
                  auVar57._0_4_ - (float)(~uVar88 & (uint)fVar59) * 0.055555556);
    auVar60._8_4_ = auVar57._8_4_ - (float)(~uVar92 & (uint)fVar63) * 0.055555556;
    auVar60._12_4_ = auVar57._12_4_ - (float)(~uVar94 & (uint)fVar64) * 0.055555556;
    auVar58._0_4_ = (float)(~uVar36 & (uint)fVar79) * 0.055555556 + auVar26._0_4_;
    auVar58._4_4_ = (float)(~uVar43 & (uint)fVar82) * 0.055555556 + auVar26._4_4_;
    auVar58._8_4_ = (float)(~uVar44 & (uint)fVar84) * 0.055555556 + auVar26._8_4_;
    auVar58._12_4_ = (float)(~uVar45 & (uint)fVar86) * 0.055555556 + auVar26._12_4_;
    auVar71 = minps(local_178,auVar26);
    auVar37 = maxps(local_158,auVar26);
    auVar66._0_8_ =
         CONCAT44(auVar26._4_4_ - (float)(~uVar90 & (uint)fVar82) * 0.055555556,
                  auVar26._0_4_ - (float)(~uVar88 & (uint)fVar79) * 0.055555556);
    auVar66._8_4_ = auVar26._8_4_ - (float)(~uVar92 & (uint)fVar84) * 0.055555556;
    auVar66._12_4_ = auVar26._12_4_ - (float)(~uVar94 & (uint)fVar86) * 0.055555556;
    auVar31._0_4_ = (float)(~uVar36 & (uint)fVar25) * 0.055555556 + auVar75._0_4_;
    auVar31._4_4_ = (float)(~uVar43 & (uint)fVar27) * 0.055555556 + auVar75._4_4_;
    auVar31._8_4_ = (float)(~uVar44 & (uint)fVar28) * 0.055555556 + auVar75._8_4_;
    auVar31._12_4_ = (float)(~uVar45 & (uint)fVar29) * 0.055555556 + auVar75._12_4_;
    auVar26 = minps(local_168,auVar75);
    auVar65 = maxps(local_148,auVar75);
    auVar54._0_8_ =
         CONCAT44(auVar75._4_4_ - (float)(~uVar90 & (uint)fVar27) * 0.055555556,
                  auVar75._0_4_ - (float)(~uVar88 & (uint)fVar25) * 0.055555556);
    auVar54._8_4_ = auVar75._8_4_ - (float)(~uVar92 & (uint)fVar28) * 0.055555556;
    auVar54._12_4_ = auVar75._12_4_ - (float)(~uVar94 & (uint)fVar29) * 0.055555556;
    auVar68._4_4_ = fVar98;
    auVar68._0_4_ = fVar95;
    auVar68._8_4_ = fVar100;
    auVar68._12_4_ = fVar102;
    auVar80._4_4_ = (float)(~uVar43 & (uint)fVar99) * 0.055555556 + fVar98;
    auVar80._0_4_ = (float)(~uVar36 & (uint)fVar96) * 0.055555556 + fVar95;
    auVar80._8_4_ = (float)(~uVar44 & (uint)fVar101) * 0.055555556 + fVar100;
    auVar80._12_4_ = (float)(~uVar45 & (uint)fVar103) * 0.055555556 + fVar102;
    auVar75 = minps(auVar48,auVar68);
    auVar68 = maxps(auVar61,auVar68);
    auVar97._0_8_ =
         CONCAT44(fVar98 - (float)(~uVar90 & (uint)fVar99) * 0.055555556,
                  fVar95 - (float)(~uVar88 & (uint)fVar96) * 0.055555556);
    auVar97._8_4_ = fVar100 - (float)(~uVar92 & (uint)fVar101) * 0.055555556;
    auVar97._12_4_ = fVar102 - (float)(~uVar94 & (uint)fVar103) * 0.055555556;
    auVar48._8_4_ = auVar60._8_4_;
    auVar48._0_8_ = auVar60._0_8_;
    auVar48._12_4_ = auVar60._12_4_;
    auVar61._4_4_ = (float)(~uVar43 & (uint)fVar62) * 0.055555556 + auVar57._4_4_;
    auVar61._0_4_ = (float)(~uVar36 & (uint)fVar59) * 0.055555556 + auVar57._0_4_;
    auVar61._8_4_ = (float)(~uVar44 & (uint)fVar63) * 0.055555556 + auVar57._8_4_;
    auVar61._12_4_ = (float)(~uVar45 & (uint)fVar64) * 0.055555556 + auVar57._12_4_;
    auVar48 = minps(auVar48,auVar61);
    local_1a8 = minps(auVar46,auVar48);
    auVar46._8_4_ = auVar66._8_4_;
    auVar46._0_8_ = auVar66._0_8_;
    auVar46._12_4_ = auVar66._12_4_;
    auVar48 = minps(auVar46,auVar58);
    local_178 = minps(auVar71,auVar48);
    auVar71._8_4_ = auVar54._8_4_;
    auVar71._0_8_ = auVar54._0_8_;
    auVar71._12_4_ = auVar54._12_4_;
    auVar48 = minps(auVar71,auVar31);
    local_168 = minps(auVar26,auVar48);
    auVar49._8_4_ = auVar97._8_4_;
    auVar49._0_8_ = auVar97._0_8_;
    auVar49._12_4_ = auVar97._12_4_;
    auVar48 = minps(auVar49,auVar80);
    auVar48 = minps(auVar75,auVar48);
    auVar61 = maxps(auVar60,auVar61);
    local_198 = maxps(auVar47,auVar61);
    auVar61 = maxps(auVar66,auVar58);
    local_158 = maxps(auVar37,auVar61);
    auVar61 = maxps(auVar54,auVar31);
    local_148 = maxps(auVar65,auVar61);
    auVar61 = maxps(auVar97,auVar80);
    auVar61 = maxps(auVar68,auVar61);
    lVar24 = 4;
    bVar21 = false;
  } while (bVar22);
  auVar37._4_4_ = local_1a8._0_4_;
  auVar37._0_4_ = local_1a8._4_4_;
  auVar37._8_4_ = local_1a8._12_4_;
  auVar37._12_4_ = local_1a8._8_4_;
  auVar68 = minps(auVar37,local_1a8);
  auVar65._0_8_ = auVar68._8_8_;
  auVar65._8_4_ = auVar68._0_4_;
  auVar65._12_4_ = auVar68._4_4_;
  auVar26 = minps(auVar65,auVar68);
  auVar50._4_4_ = local_178._0_4_;
  auVar50._0_4_ = local_178._4_4_;
  auVar50._8_4_ = local_178._12_4_;
  auVar50._12_4_ = local_178._8_4_;
  auVar68 = minps(auVar50,local_178);
  auVar47._0_8_ = auVar68._8_8_;
  auVar47._8_4_ = auVar68._0_4_;
  auVar47._12_4_ = auVar68._4_4_;
  auVar68 = minps(auVar47,auVar68);
  auVar30._4_4_ = local_168._0_4_;
  auVar30._0_4_ = local_168._4_4_;
  auVar30._8_4_ = local_168._12_4_;
  auVar30._12_4_ = local_168._8_4_;
  auVar31 = minps(auVar30,local_168);
  auVar38._0_8_ = auVar31._8_8_;
  auVar38._8_4_ = auVar31._0_4_;
  auVar38._12_4_ = auVar31._4_4_;
  auVar37 = minps(auVar38,auVar31);
  auVar32._4_4_ = local_198._0_4_;
  auVar32._0_4_ = local_198._4_4_;
  auVar32._8_4_ = local_198._12_4_;
  auVar32._12_4_ = local_198._8_4_;
  auVar31 = maxps(auVar32,local_198);
  auVar39._0_8_ = auVar31._8_8_;
  auVar39._8_4_ = auVar31._0_4_;
  auVar39._12_4_ = auVar31._4_4_;
  auVar46 = maxps(auVar39,auVar31);
  auVar51._4_4_ = local_158._0_4_;
  auVar51._0_4_ = local_158._4_4_;
  auVar51._8_4_ = local_158._12_4_;
  auVar51._12_4_ = local_158._8_4_;
  auVar31 = maxps(auVar51,local_158);
  auVar33._0_8_ = auVar31._8_8_;
  auVar33._8_4_ = auVar31._0_4_;
  auVar33._12_4_ = auVar31._4_4_;
  auVar31 = maxps(auVar33,auVar31);
  auVar40._4_4_ = local_148._0_4_;
  auVar40._0_4_ = local_148._4_4_;
  auVar40._8_4_ = local_148._12_4_;
  auVar40._12_4_ = local_148._8_4_;
  auVar47 = maxps(auVar40,local_148);
  auVar52._0_8_ = auVar47._8_8_;
  auVar52._8_4_ = auVar47._0_4_;
  auVar52._12_4_ = auVar47._4_4_;
  auVar47 = maxps(auVar52,auVar47);
  auVar41._4_4_ = auVar48._0_4_;
  auVar41._0_4_ = auVar48._4_4_;
  auVar41._8_4_ = auVar48._12_4_;
  auVar41._12_4_ = auVar48._8_4_;
  auVar48 = minps(auVar41,auVar48);
  auVar53._0_8_ = auVar48._8_8_;
  auVar53._8_4_ = auVar48._0_4_;
  auVar53._12_4_ = auVar48._4_4_;
  auVar48 = minps(auVar53,auVar48);
  auVar55._4_4_ = auVar61._0_4_;
  auVar55._0_4_ = auVar61._4_4_;
  auVar55._8_4_ = auVar61._12_4_;
  auVar55._12_4_ = auVar61._8_4_;
  auVar61 = maxps(auVar55,auVar61);
  auVar42._0_8_ = auVar61._8_8_;
  auVar42._8_4_ = auVar61._0_4_;
  auVar42._12_4_ = auVar61._4_4_;
  auVar61 = maxps(auVar42,auVar61);
  fVar85 = ABS(auVar61._0_4_);
  if (ABS(auVar61._0_4_) <= ABS(auVar48._0_4_)) {
    fVar85 = ABS(auVar48._0_4_);
  }
  fVar69 = auVar26._0_4_ - fVar85;
  fVar77 = auVar68._0_4_ - fVar85;
  fVar78 = auVar37._0_4_ - fVar85;
  fVar81 = fVar85 + auVar46._0_4_;
  fVar83 = fVar85 + auVar31._0_4_;
  fVar91 = fVar85 + auVar47._0_4_;
  auVar34._0_8_ = CONCAT44(fVar77,fVar69) & 0x7fffffff7fffffff;
  auVar34._8_4_ = ABS(fVar78);
  auVar34._12_4_ = ABS(0.0 - fVar85);
  auVar56._0_8_ = CONCAT44(fVar83,fVar81) & 0x7fffffff7fffffff;
  auVar56._8_4_ = ABS(fVar91);
  auVar56._12_4_ = ABS(fVar85 + 0.0);
  auVar61 = maxps(auVar34,auVar56);
  fVar67 = auVar61._4_4_;
  if (auVar61._4_4_ <= auVar61._0_4_) {
    fVar67 = auVar61._0_4_;
  }
  auVar35._8_8_ = auVar61._8_8_;
  auVar35._0_8_ = auVar61._8_8_;
  if (auVar61._8_4_ <= fVar67) {
    auVar35._0_4_ = fVar67;
  }
  fVar67 = auVar35._0_4_ * 4.7683716e-07;
  (__return_storage_ptr__->lower).field_0.m128[0] = fVar69 - fVar67;
  (__return_storage_ptr__->lower).field_0.m128[1] = fVar77 - fVar67;
  (__return_storage_ptr__->lower).field_0.m128[2] = fVar78 - fVar67;
  (__return_storage_ptr__->lower).field_0.m128[3] = (0.0 - fVar85) - fVar67;
  (__return_storage_ptr__->upper).field_0.m128[0] = fVar67 + fVar81;
  (__return_storage_ptr__->upper).field_0.m128[1] = fVar67 + fVar83;
  (__return_storage_ptr__->upper).field_0.m128[2] = fVar67 + fVar91;
  (__return_storage_ptr__->upper).field_0.m128[3] = fVar67 + fVar85 + 0.0;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }